

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

void secp256k1_ecmult_endo_split
               (secp256k1_scalar *s1,secp256k1_scalar *s2,secp256k1_ge *p1,secp256k1_ge *p2)

{
  secp256k1_scalar sVar1;
  secp256k1_scalar tmp;
  secp256k1_scalar local_24;
  
  secp256k1_scalar_split_lambda(s1,s2,&local_24);
  secp256k1_ge_mul_lambda(p2,p1);
  secp256k1_scalar_verify(s1);
  if (6 < *s1) {
    secp256k1_scalar_verify(s1);
    sVar1 = 0xd - *s1;
    if (*s1 == 0) {
      sVar1 = 0;
    }
    *s1 = sVar1;
    secp256k1_scalar_verify(s1);
    secp256k1_ge_neg(p1,p1);
  }
  secp256k1_scalar_verify(s2);
  if (6 < *s2) {
    secp256k1_scalar_verify(s2);
    sVar1 = 0xd - *s2;
    if (*s2 == 0) {
      sVar1 = 0;
    }
    *s2 = sVar1;
    secp256k1_scalar_verify(s2);
    secp256k1_ge_neg(p2,p2);
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_endo_split(secp256k1_scalar *s1, secp256k1_scalar *s2, secp256k1_ge *p1, secp256k1_ge *p2) {
    secp256k1_scalar tmp = *s1;
    secp256k1_scalar_split_lambda(s1, s2, &tmp);
    secp256k1_ge_mul_lambda(p2, p1);

    if (secp256k1_scalar_is_high(s1)) {
        secp256k1_scalar_negate(s1, s1);
        secp256k1_ge_neg(p1, p1);
    }
    if (secp256k1_scalar_is_high(s2)) {
        secp256k1_scalar_negate(s2, s2);
        secp256k1_ge_neg(p2, p2);
    }
}